

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O1

string * getFilenameExt(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  char *pcVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  pcVar2 = (char *)std::__cxx11::string::find_last_of
                             ((char *)__return_storage_ptr__,0x3e1317,0xffffffffffffffff);
  if (pcVar2 < (char *)__return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x3d2f67);
  }
  return __return_storage_ptr__;
}

Assistant:

static const std::string getFilenameExt(const std::string filename) {
  // Extract file name extension
  std::string name = filename;
  std::size_t found = name.find_last_of(".");
  if (found < name.size()) {
    name = name.substr(found + 1);
  } else {
    name = "";
  }
  return name;
}